

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Abc_NtkDelayOpt(Sfm_Dec_t *p)

{
  Abc_Ntk_t *pNtk_00;
  Sfm_Par_t *pPars_00;
  Abc_Ntk_t *pNtk_01;
  bool bVar1;
  int iVar2;
  uint Id;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint Id_00;
  int iVar7;
  int iVar8;
  Abc_Obj_t *pAVar9;
  abctime aVar10;
  abctime aVar11;
  int local_7c;
  int i_1;
  int Var;
  int DelayOld;
  int OldId;
  int RetValue;
  int Limit;
  int i;
  abctime clk;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  int n;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  Sfm_Dec_t *p_local;
  
  pNtk_00 = p->pNtk;
  pPars_00 = p->pPars;
  Abc_NtkCleanMarkABC(pNtk_00);
  pObj._4_4_ = 0;
  while( true ) {
    bVar1 = true;
    if (pPars_00->nNodesMax != 0) {
      bVar1 = pObj._4_4_ < pPars_00->nNodesMax;
    }
    if (!bVar1) break;
    if (pPars_00->iNodeOne == 0) {
      if (((p->pTim != (Sfm_Tim_t *)0x0) &&
          (iVar2 = Sfm_TimPriorityNodes(p->pTim,&p->vCands,p->pPars->nTimeWin), iVar2 == 0)) ||
         ((p->pMit != (Sfm_Mit_t *)0x0 &&
          (iVar2 = Sfm_MitPriorityNodes(p->pMit,&p->vCands,p->pPars->nTimeWin), iVar2 == 0))))
      break;
    }
    else {
      Vec_IntFill(&p->vCands,1,pPars_00->iNodeOne);
    }
    for (RetValue = 0; iVar2 = Vec_IntSize(&p->vCands), RetValue < iVar2; RetValue = RetValue + 1) {
      pNtk_01 = p->pNtk;
      iVar2 = Vec_IntEntry(&p->vCands,RetValue);
      pAVar9 = Abc_NtkObj(pNtk_01,iVar2);
      if (pAVar9 != (Abc_Obj_t *)0x0) {
        Id = Abc_ObjId(pAVar9);
        iVar2 = Sfm_ManReadObjDelay(p,Id);
        if ((*(uint *)&pAVar9->field_0x14 >> 4 & 1) != 0) {
          __assert_fail("pObj->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x7cc,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
        }
        p->nNodesTried = p->nNodesTried + 1;
        aVar10 = Abc_Clock();
        iVar3 = Sfm_DecExtract(pNtk_00,pPars_00,pAVar9,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                               &p->vObjMap,&p->vTemp,&p->vTemp2,&p->vObjMffc,&p->vObjInMffc,p->pTim,
                               p->pMit);
        p->nDivs = iVar3;
        aVar11 = Abc_Clock();
        p->timeWin = (aVar11 - aVar10) + p->timeWin;
        if ((p->nDivs < 2) ||
           ((pPars_00->nWinSizeMax != 0 &&
            (iVar3 = pPars_00->nWinSizeMax, iVar4 = Vec_IntSize(&p->vObjGates), iVar3 < iVar4)))) {
          *(uint *)&pAVar9->field_0x14 = *(uint *)&pAVar9->field_0x14 & 0xffffffef | 0x10;
        }
        else {
          iVar3 = Vec_IntSize(&p->vObjMffc);
          p->nMffc = iVar3;
          iVar3 = Sfm_DecMffcArea(pNtk_00,&p->vObjMffc);
          p->AreaMffc = iVar3;
          iVar3 = Abc_MaxInt(p->nMaxDivs,p->nDivs);
          p->nMaxDivs = iVar3;
          p->nAllDivs = (long)p->nDivs + p->nAllDivs;
          p->iTarget = (pAVar9->field_6).iTemp;
          iVar3 = Vec_IntSize(&p->vObjGates);
          iVar4 = Abc_MaxInt(p->nMaxWin,iVar3);
          p->nMaxWin = iVar4;
          p->nAllWin = (long)iVar3 + p->nAllWin;
          aVar10 = Abc_Clock();
          iVar4 = Sfm_DecPrepareSolver(p);
          aVar11 = Abc_Clock();
          p->timeCnf = (aVar11 - aVar10) + p->timeCnf;
          if (iVar4 == 0) {
            *(uint *)&pAVar9->field_0x14 = *(uint *)&pAVar9->field_0x14 & 0xffffffef | 0x10;
          }
          else {
            aVar10 = Abc_Clock();
            DelayOld = Sfm_DecPeformDec3(p,pAVar9);
            if ((pPars_00->fMoreEffort != 0) && (DelayOld < 0)) {
              local_7c = Vec_IntSize(&p->vObjInMffc);
              do {
                local_7c = local_7c + -1;
                if (local_7c < 0) goto LAB_0060b975;
                iVar4 = Vec_IntEntry(&p->vObjInMffc,local_7c);
                p->iUseThis = iVar4;
                DelayOld = Sfm_DecPeformDec3(p,pAVar9);
                p->iUseThis = -1;
              } while (DelayOld < 0);
              p->nEfforts = p->nEfforts + 1;
            }
LAB_0060b975:
            if (p->pPars->fVeryVerbose != 0) {
              printf("\n\n");
            }
            aVar11 = Abc_Clock();
            p->timeSat = (aVar11 - aVar10) + p->timeSat;
            if (-1 < DelayOld) {
              iVar4 = Vec_IntSize(&p->vObjGates);
              if (iVar4 - iVar3 < 1) {
                __assert_fail("Vec_IntSize(&p->vObjGates) - Limit > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x808,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
              }
              iVar4 = Vec_IntSize(&p->vObjGates);
              if (2 < iVar4 - iVar3) {
                __assert_fail("Vec_IntSize(&p->vObjGates) - Limit <= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x809,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
              }
              p->nNodesChanged = p->nNodesChanged + 1;
              Abc_NtkCountStats(p,iVar3);
              if (p->pMit != (Sfm_Mit_t *)0x0) {
                Sfm_MitUpdateLoad(p->pMit,&p->vTemp3,0);
              }
              Sfm_DecInsert(pNtk_00,pAVar9,iVar3,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                            &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,&p->vTemp,
                            p->pMit);
              if (p->pMit != (Sfm_Mit_t *)0x0) {
                Sfm_MitUpdateLoad(p->pMit,&p->vTemp,1);
              }
              aVar10 = Abc_Clock();
              if (p->pMit == (Sfm_Mit_t *)0x0) {
                Sfm_TimUpdateTiming(p->pTim,&p->vTemp);
              }
              else {
                Sfm_MitUpdateTiming(p->pMit,&p->vTemp);
              }
              aVar11 = Abc_Clock();
              p->timeTime = (aVar11 - aVar10) + p->timeTime;
              iVar3 = Abc_NtkObjNumMax(pNtk_00);
              pAVar9 = Abc_NtkObj(pNtk_00,iVar3 + -1);
              if ((p->pMit == (Sfm_Mit_t *)0x0) && (p->DelayMin != 0)) {
                iVar3 = p->DelayMin;
                uVar5 = Abc_ObjId(pAVar9);
                iVar4 = Sfm_ManReadObjDelay(p,uVar5);
                if (iVar3 != iVar4) {
                  __assert_fail("p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                                ,0x818,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
              }
              if (pPars_00->fDelayVerbose != 0) {
                uVar5 = Abc_NtkObjNumMax(p->pNtk);
                uVar6 = Vec_IntSize(&p->vCands);
                iVar3 = Vec_IntSize(&p->vCands);
                iVar4 = Abc_NtkNodeNum(p->pNtk);
                Id_00 = Abc_ObjId(pAVar9);
                iVar7 = Sfm_ManReadObjDelay(p,Id_00);
                iVar8 = Sfm_ManReadNtkDelay(p);
                printf("Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f\n"
                       ,((double)iVar3 * 100.0) / (double)iVar4,(double)iVar2 * 0.001,
                       (double)iVar7 * 0.001,(double)iVar8 * 0.001,(ulong)Id,(ulong)uVar5,
                       (ulong)(uint)RetValue,(ulong)uVar6);
              }
              break;
            }
            *(uint *)&pAVar9->field_0x14 = *(uint *)&pAVar9->field_0x14 & 0xffffffef | 0x10;
          }
        }
      }
    }
    if (pPars_00->iNodeOne != 0) break;
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  Abc_NtkCleanMarkABC(pNtk_00);
  return;
}

Assistant:

void Abc_NtkDelayOpt( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars; int n;
    Abc_NtkCleanMarkABC( pNtk );
    for ( n = 0; pPars->nNodesMax == 0 || n < pPars->nNodesMax; n++ )
    {
        Abc_Obj_t * pObj, * pObjNew; abctime clk;
        int i = 0, Limit, RetValue;
        // collect nodes
        if ( pPars->iNodeOne )
            Vec_IntFill( &p->vCands, 1, pPars->iNodeOne );
        else if ( p->pTim && !Sfm_TimPriorityNodes(p->pTim, &p->vCands, p->pPars->nTimeWin) )
            break;
        else if ( p->pMit && !Sfm_MitPriorityNodes(p->pMit, &p->vCands, p->pPars->nTimeWin) )
            break;
        // try improving delay for the nodes according to the priority
        Abc_NtkForEachObjVec( &p->vCands, p->pNtk, pObj, i )
        {
            int OldId = Abc_ObjId(pObj);
            int DelayOld = Sfm_ManReadObjDelay(p, OldId);
            assert( pObj->fMarkA == 0 );
            p->nNodesTried++;
clk = Abc_Clock();
            p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vTemp, &p->vTemp2, &p->vObjMffc, &p->vObjInMffc, p->pTim, p->pMit );
p->timeWin += Abc_Clock() - clk;
            if ( p->nDivs < 2 || (pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates)) )
            { 
                pObj->fMarkA = 1;
                continue;
            }
            p->nMffc = Vec_IntSize(&p->vObjMffc);
            p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
            p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
            p->nAllDivs += p->nDivs;
            p->iTarget = pObj->iTemp;
            Limit = Vec_IntSize( &p->vObjGates );
            p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
            p->nAllWin += Limit;
clk = Abc_Clock();
            RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
            if ( !RetValue )
            {
                pObj->fMarkA = 1;
                continue;
            }
clk = Abc_Clock();
            RetValue = Sfm_DecPeformDec3( p, pObj );
            if ( pPars->fMoreEffort && RetValue < 0 )
            {
                int Var, i;
                Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
                {
                    p->iUseThis = Var; 
                    RetValue = Sfm_DecPeformDec3( p, pObj );
                    p->iUseThis = -1;
                    if ( RetValue < 0 )
                    {
                        //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
                    }
                    else
                    {
                        p->nEfforts++;
                        if ( p->pPars->fVerbose )
                        {
                            //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                            //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                        }
                        break;
                    }
                }
            }
            if ( p->pPars->fVeryVerbose )
                printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
            if ( RetValue < 0 )
            {
                pObj->fMarkA = 1;
                continue;
            }
            assert( Vec_IntSize(&p->vObjGates) - Limit > 0 );
            assert( Vec_IntSize(&p->vObjGates) - Limit <= 2 );
            p->nNodesChanged++;
            Abc_NtkCountStats( p, Limit );
            // reduce load due to removed MFFC
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vTemp3, 0 ); // assuming &p->vTemp3 contains MFFC
            Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, &p->vTemp, p->pMit );
            // increase load due to added new nodes
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vTemp, 1 ); // assuming &p->vTemp contains new nodes
clk = Abc_Clock();
            if ( p->pMit )
                Sfm_MitUpdateTiming( p->pMit, &p->vTemp );
            else
                Sfm_TimUpdateTiming( p->pTim, &p->vTemp );
p->timeTime += Abc_Clock() - clk;
            pObjNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk)-1 );
            assert( p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)) );
            // report
            if ( pPars->fDelayVerbose )
                printf( "Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f\n", 
                    OldId, Abc_NtkObjNumMax(p->pNtk), i, Vec_IntSize(&p->vCands), 100.0 * Vec_IntSize(&p->vCands) / Abc_NtkNodeNum(p->pNtk),
                    MIO_NUMINV*DelayOld, MIO_NUMINV*Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)), 
                    MIO_NUMINV*Sfm_ManReadNtkDelay(p) );
            break;
        }
        if ( pPars->iNodeOne )
            break;
    }
    Abc_NtkCleanMarkABC( pNtk );
}